

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall QTableView::sizeHintForColumn(QTableView *this,int column)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTableViewPrivate *pQVar4;
  QAbstractItemModel *pQVar5;
  int *piVar6;
  undefined4 in_ESI;
  QStyleOptionViewItem *in_RDI;
  long in_FS_OFFSET;
  int logrow_1;
  int logrow;
  int logicalIdx;
  int idxBottom;
  int idxTop;
  int actualBottom;
  int logicalRow;
  int row;
  int rowsProcessed;
  int hint;
  int bottom;
  int top;
  int maximumProcessRows;
  QTableViewPrivate *d;
  QModelIndex index;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  QAbstractItemModel *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  int iVar7;
  undefined4 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  undefined1 in_stack_fffffffffffffdee;
  undefined1 in_stack_fffffffffffffdef;
  undefined1 uVar8;
  QWidget *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  int iVar9;
  int local_1d0;
  int local_1cc;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  QStyleOptionViewItem *pQVar10;
  int local_18c;
  QPersistentModelIndex local_188 [3];
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  QPersistentModelIndex local_158 [3];
  QPersistentModelIndex local_140 [3];
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  QPersistentModelIndex local_f8 [3];
  int local_e0 [2];
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar10 = in_RDI;
  pQVar4 = d_func((QTableView *)0x8bdcad);
  pQVar5 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if (pQVar5 == (QAbstractItemModel *)0x0) {
    local_18c = -1;
  }
  else {
    QWidget::ensurePolished(in_stack_fffffffffffffdf8);
    iVar2 = QHeaderView::resizeContentsPrecision
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0))
    ;
    local_e0[1] = 0;
    local_e0[0] = QHeaderView::visualIndexAt
                            ((QHeaderView *)
                             CONCAT17(in_stack_fffffffffffffdef,
                                      CONCAT16(in_stack_fffffffffffffdee,
                                               CONCAT24(in_stack_fffffffffffffdec,
                                                        in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
    piVar6 = qMax<int>(local_e0 + 1,local_e0);
    local_1cc = *piVar6;
    QWidget::height((QWidget *)0x8bdd68);
    local_1b4 = QHeaderView::visualIndexAt
                          ((QHeaderView *)
                           CONCAT17(in_stack_fffffffffffffdef,
                                    CONCAT16(in_stack_fffffffffffffdee,
                                             CONCAT24(in_stack_fffffffffffffdec,
                                                      in_stack_fffffffffffffde8))),
                           in_stack_fffffffffffffde4);
    bVar1 = QWidget::isVisible((QWidget *)0x8bdd85);
    if ((!bVar1) || (local_1b4 == -1)) {
      pQVar5 = (pQVar4->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
      local_1b4 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,local_f8);
      local_1b4 = local_1b4 + -1;
    }
    memset(local_d8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8bde06);
    (**(code **)(*(long *)&in_RDI->super_QStyleOption + 0x2f8))(in_RDI,local_d8);
    local_1b8 = 0;
    local_1bc = 0;
    local_110 = &DAT_aaaaaaaaaaaaaaaa;
    local_108 = &DAT_aaaaaaaaaaaaaaaa;
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8bde69);
    for (local_1c0 = local_1cc; local_1c0 <= local_1b4; local_1c0 = local_1c0 + 1) {
      iVar3 = QHeaderView::logicalIndex
                        ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
      bVar1 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT17(in_stack_fffffffffffffdef,
                                  CONCAT16(in_stack_fffffffffffffdee,
                                           CONCAT24(in_stack_fffffffffffffdec,
                                                    in_stack_fffffffffffffde8))),
                         in_stack_fffffffffffffde4);
      if (!bVar1) {
        pQVar5 = (pQVar4->super_QAbstractItemViewPrivate).model;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_140);
        (**(code **)(*(long *)pQVar5 + 0x60))(&local_128,pQVar5,iVar3,in_ESI,local_140);
        local_110 = local_128;
        local_108 = local_120;
        local_100 = local_118;
        local_1b8 = QTableViewPrivate::widthHintForIndex
                              ((QTableViewPrivate *)
                               CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               (int)((ulong)pQVar10 >> 0x20),in_RDI);
        local_1bc = local_1bc + 1;
        if (local_1bc == iVar2) break;
      }
    }
    pQVar5 = (pQVar4->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_158);
    iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,local_158);
    iVar3 = iVar3 + -1;
    local_1d0 = local_1c0 + -1;
    if ((iVar2 == 0) || (iVar3 < local_1cc)) {
      local_1bc = iVar2;
    }
    while( true ) {
      bVar1 = local_1bc != iVar2;
      if (bVar1) {
        in_stack_fffffffffffffdee = 0 < local_1cc || local_1d0 < iVar3;
      }
      uVar8 = bVar1 && (0 < local_1cc || local_1d0 < iVar3);
      if (!bVar1 || 0 >= local_1cc && local_1d0 >= iVar3) break;
      iVar9 = -1;
      if (((local_1bc % 2 == 0) || (local_1cc < 1)) && (local_1d0 != iVar3)) {
        do {
          iVar7 = iVar9;
          if (iVar3 <= local_1d0) break;
          local_1d0 = local_1d0 + 1;
          in_stack_fffffffffffffe24 =
               QHeaderView::logicalIndex
                         ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
          bVar1 = QHeaderView::isSectionHidden
                            ((QHeaderView *)
                             CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffdee,
                                                     CONCAT24(in_stack_fffffffffffffdec,
                                                              in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
          iVar7 = in_stack_fffffffffffffe24;
        } while (bVar1);
      }
      else {
        do {
          iVar7 = iVar9;
          if (local_1cc < 1) break;
          local_1cc = local_1cc + -1;
          in_stack_fffffffffffffe28 =
               QHeaderView::logicalIndex
                         ((QHeaderView *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4);
          bVar1 = QHeaderView::isSectionHidden
                            ((QHeaderView *)
                             CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffdee,
                                                     CONCAT24(in_stack_fffffffffffffdec,
                                                              in_stack_fffffffffffffde8))),
                             in_stack_fffffffffffffde4);
          iVar7 = in_stack_fffffffffffffe28;
        } while (bVar1);
      }
      if (-1 < iVar7) {
        in_stack_fffffffffffffdd8 = (pQVar4->super_QAbstractItemViewPrivate).model;
        in_stack_fffffffffffffde8 = in_ESI;
        iVar9 = iVar7;
        QPersistentModelIndex::operator_cast_to_QModelIndex(local_188);
        (**(code **)(*(long *)in_stack_fffffffffffffdd8 + 0x60))
                  (&local_170,in_stack_fffffffffffffdd8,iVar7,in_stack_fffffffffffffde8,local_188);
        local_110 = local_170;
        local_108 = local_168;
        local_100 = local_160;
        local_1b8 = QTableViewPrivate::widthHintForIndex
                              ((QTableViewPrivate *)CONCAT44(iVar9,in_stack_fffffffffffffe28),
                               (QModelIndex *)
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               (int)((ulong)pQVar10 >> 0x20),in_RDI);
        in_stack_fffffffffffffde4 = iVar7;
      }
      local_1bc = local_1bc + 1;
    }
    if ((pQVar4->showGrid & 1U) != 0) {
      local_1b8 = local_1b8 + 1;
    }
    QStyleOptionViewItem::~QStyleOptionViewItem
              ((QStyleOptionViewItem *)CONCAT44(local_1b8,in_stack_fffffffffffffdd0));
    local_18c = local_1b8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18c;
  }
  __stack_chk_fail();
}

Assistant:

int QTableView::sizeHintForColumn(int column) const
{
    Q_D(const QTableView);

    if (!model())
        return -1;

    ensurePolished();
    const int maximumProcessRows = d->horizontalHeader->resizeContentsPrecision();

    int top = qMax(0, d->verticalHeader->visualIndexAt(0));
    int bottom = d->verticalHeader->visualIndexAt(d->viewport->height());
    if (!isVisible() || bottom == -1) // the table don't have enough rows to fill the viewport
        bottom = d->model->rowCount(d->root) - 1;

    QStyleOptionViewItem option;
    initViewItemOption(&option);

    int hint = 0;
    int rowsProcessed = 0;
    QModelIndex index;
    int row = top;
    for (; row <= bottom; ++row) {
        int logicalRow = d->verticalHeader->logicalIndex(row);
        if (d->verticalHeader->isSectionHidden(logicalRow))
            continue;
        index = d->model->index(logicalRow, column, d->root);

        hint = d->widthHintForIndex(index, hint, option);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    const int actualBottom = d->model->rowCount(d->root) - 1;
    int idxTop = top;
    int idxBottom = row - 1;

    if (maximumProcessRows == 0 || actualBottom < idxTop)
        rowsProcessed = maximumProcessRows;  // skip the while loop

    while (rowsProcessed != maximumProcessRows && (idxTop > 0 || idxBottom < actualBottom)) {
        int logicalIdx  = -1;

        if ((rowsProcessed % 2 && idxTop > 0) || idxBottom == actualBottom) {
            while (idxTop > 0) {
                --idxTop;
                int logrow = d->verticalHeader->logicalIndex(idxTop);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        } else {
            while (idxBottom < actualBottom) {
                ++idxBottom;
                int logrow = d->verticalHeader->logicalIndex(idxBottom);
                if (d->verticalHeader->isSectionHidden(logrow))
                    continue;
                logicalIdx = logrow;
                break;
            }
        }
        if (logicalIdx >= 0) {
            index = d->model->index(logicalIdx, column, d->root);
            hint = d->widthHintForIndex(index, hint, option);
        }
        ++rowsProcessed;
    }

    return d->showGrid ? hint + 1 : hint;
}